

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httprequestparser.h
# Opt level: O2

bool __thiscall httpparser::HttpRequestParser::isSpecial(HttpRequestParser *this,int c)

{
  bool bVar1;
  
  bVar1 = true;
  if (((0x37 < c - 9U) || ((0xfe004982800001U >> ((ulong)(c - 9U) & 0x3f) & 1) == 0)) &&
     ((0x22 < c - 0x5bU || ((0x500000007U >> ((ulong)(c - 0x5bU) & 0x3f) & 1) == 0)))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool isSpecial(int c)
    {
        switch (c)
        {
        case '(': case ')': case '<': case '>': case '@':
        case ',': case ';': case ':': case '\\': case '"':
        case '/': case '[': case ']': case '?': case '=':
        case '{': case '}': case ' ': case '\t':
            return true;
        default:
            return false;
        }
    }